

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

jx9_value * jx9_array_fetch(jx9_value *pArray,char *zKey,int nByte)

{
  sxi32 sVar1;
  undefined1 local_78 [4];
  int rc;
  jx9_value skey;
  jx9_value *pValue;
  jx9_hashmap_node *pNode;
  char *pcStack_20;
  int nByte_local;
  char *zKey_local;
  jx9_value *pArray_local;
  
  if ((pArray->iFlags & 0x40U) == 0) {
    pArray_local = (jx9_value *)0x0;
  }
  else {
    pNode._4_4_ = nByte;
    pcStack_20 = zKey;
    zKey_local = (char *)pArray;
    if (nByte < 0) {
      pNode._4_4_ = SyStrlen(zKey);
    }
    jx9MemObjInit(*(jx9_vm **)(zKey_local + 0x10),(jx9_value *)local_78);
    jx9MemObjStringAppend((jx9_value *)local_78,pcStack_20,pNode._4_4_);
    sVar1 = jx9HashmapLookup(*(jx9_hashmap **)zKey_local,(jx9_value *)local_78,
                             (jx9_hashmap_node **)&pValue);
    jx9MemObjRelease((jx9_value *)local_78);
    if (sVar1 == 0) {
      pArray_local = (jx9_value *)
                     SySetAt((SySet *)(*(long *)(zKey_local + 0x10) + 0x200),pValue->nIdx);
    }
    else {
      pArray_local = (jx9_value *)0x0;
    }
  }
  return pArray_local;
}

Assistant:

JX9_PRIVATE jx9_value * jx9_array_fetch(jx9_value *pArray, const char *zKey, int nByte)
{
	jx9_hashmap_node *pNode;
	jx9_value *pValue;
	jx9_value skey;
	int rc;
	/* Make sure we are dealing with a valid hashmap */
	if( (pArray->iFlags & MEMOBJ_HASHMAP) == 0 ){
		return 0;
	}
	if( nByte < 0 ){
		nByte = (int)SyStrlen(zKey);
	}
	/* Convert the key to a jx9_value  */
	jx9MemObjInit(pArray->pVm, &skey);
	jx9MemObjStringAppend(&skey, zKey, (sxu32)nByte);
	/* Perform the lookup */
	rc = jx9HashmapLookup((jx9_hashmap *)pArray->x.pOther, &skey, &pNode);
	jx9MemObjRelease(&skey);
	if( rc != JX9_OK ){
		/* No such entry */
		return 0;
	}
	/* Extract the target value */
	pValue = (jx9_value *)SySetAt(&pArray->pVm->aMemObj, pNode->nValIdx);
	return pValue;
}